

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O3

c_int osqp_solve(OSQPWorkspace *work)

{
  ulong compute_objective;
  int iVar1;
  OSQPSettings *pOVar2;
  c_int cVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  OSQPInfo *pOVar7;
  long lVar8;
  bool bVar9;
  c_float cVar10;
  double dVar11;
  double dVar12;
  ulong local_78;
  long local_70;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar3 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_solve");
    return cVar3;
  }
  if (work->clear_update_time == 1) {
    work->info->update_time = 0.0;
  }
  work->rho_update_from_solve = 1;
  compute_objective = work->settings->verbose;
  osqp_tic(work->timer);
  if (work->settings->verbose != 0) {
    print_header();
  }
  osqp_start_interrupt_listener();
  pOVar2 = work->settings;
  if (pOVar2->warm_start == 0) {
    cold_start(work);
    pOVar2 = work->settings;
  }
  if (pOVar2->max_iter < 1) {
    local_70 = 1;
    local_78 = compute_objective;
  }
  else {
    uVar6 = 1;
    bVar9 = false;
    lVar5 = 0;
    do {
      lVar8 = lVar5;
      swap_vectors(&work->x,&work->x_prev);
      swap_vectors(&work->z,&work->z_prev);
      update_xz_tilde(work);
      update_x(work);
      update_z(work);
      update_y(work);
      iVar1 = osqp_is_interrupted();
      if (iVar1 != 0) {
        update_status(work->info,-5);
        puts("Solver interrupted");
LAB_001a95b7:
        cVar3 = 1;
        goto LAB_001a97cd;
      }
      local_70 = lVar8 + 1;
      dVar11 = *(double *)(work->info->status + (ulong)(work->first_run == 0) * 0x10 + 0x48);
      cVar10 = osqp_toc(work->timer);
      pOVar2 = work->settings;
      dVar12 = pOVar2->time_limit;
      if (((dVar12 != 0.0) || (NAN(dVar12))) && (dVar12 <= dVar11 + cVar10)) {
        update_status(work->info,-6);
        if (work->settings->verbose != 0) {
          puts("run time limit reached");
        }
        local_78 = 0;
        goto LAB_001a95f9;
      }
      if (pOVar2->check_termination == 0) {
        bVar9 = false;
        bVar4 = false;
        local_78 = 0;
        if (pOVar2->verbose != 0) goto LAB_001a9378;
      }
      else {
        lVar5 = local_70 % pOVar2->check_termination;
        bVar9 = lVar5 == 0;
        if (pOVar2->verbose == 0) {
          if (lVar5 != 0) {
            bVar9 = false;
            bVar4 = false;
            local_78 = 0;
            goto LAB_001a943c;
          }
          update_info(work,local_70,compute_objective,0);
          bVar9 = true;
          local_78 = 0;
LAB_001a9426:
          cVar3 = check_termination(work,0);
          bVar4 = true;
          if (cVar3 != 0) goto LAB_001a9649;
        }
        else {
LAB_001a9378:
          bVar4 = lVar8 == 0 || (uVar6 / 200) * 200 + -1 == lVar8;
          local_78 = (ulong)bVar4;
          if ((bVar4) || (bVar9)) {
            update_info(work,local_70,compute_objective,0);
            if (local_78 != 0) {
              print_summary(work);
            }
            local_78 = (ulong)(local_78 != 0);
            bVar4 = true;
            if (bVar9) goto LAB_001a9426;
          }
          else {
            bVar4 = false;
          }
        }
      }
LAB_001a943c:
      pOVar2 = work->settings;
      if ((pOVar2->adaptive_rho != 0) && (pOVar2->adaptive_rho_interval == 0)) {
        cVar10 = osqp_toc(work->timer);
        pOVar2 = work->settings;
        if (pOVar2->adaptive_rho_fraction * work->info->setup_time < cVar10) {
          if (pOVar2->check_termination == 0) {
            dVar11 = (double)local_70 + 12.5;
            dVar12 = 25.0;
          }
          else {
            dVar12 = (double)pOVar2->check_termination;
            dVar11 = dVar12 * 0.5 + (double)local_70;
          }
          dVar12 = fmod(dVar11,dVar12);
          pOVar2 = work->settings;
          lVar5 = pOVar2->check_termination;
          if (pOVar2->check_termination < (long)(dVar11 - dVar12)) {
            lVar5 = (long)(dVar11 - dVar12);
          }
          pOVar2->adaptive_rho_interval = lVar5;
        }
      }
      if (((pOVar2->adaptive_rho != 0) && (pOVar2->adaptive_rho_interval != 0)) &&
         (local_70 % pOVar2->adaptive_rho_interval == 0)) {
        if (!bVar4) {
          update_info(work,local_70,compute_objective,0);
        }
        cVar3 = adapt_rho(work);
        if (cVar3 != 0) {
          printf("ERROR in %s: ","osqp_solve");
          printf("Failed rho update");
          putchar(10);
          goto LAB_001a95b7;
        }
        pOVar2 = work->settings;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar8 + 1;
    } while (lVar8 + 1 < pOVar2->max_iter);
    local_70 = lVar8 + 2;
LAB_001a95f9:
    if (bVar9) goto LAB_001a9649;
  }
  if (local_78 == 0) {
    update_info(work,local_70 + -1,compute_objective,0);
  }
  if ((work->settings->verbose != 0) && (work->summary_printed == 0)) {
    print_summary(work);
  }
  check_termination(work,0);
LAB_001a9649:
  if ((compute_objective == 0) && (cVar3 = has_solution(work->info), cVar3 != 0)) {
    cVar10 = compute_obj_val(work,work->x);
    work->info->obj_val = cVar10;
  }
  if ((work->settings->verbose != 0) && (work->summary_printed == 0)) {
    print_summary(work);
  }
  pOVar7 = work->info;
  if (pOVar7->status_val == -10) {
    cVar3 = check_termination(work,1);
    pOVar7 = work->info;
    if (cVar3 == 0) {
      update_status(pOVar7,-2);
      pOVar7 = work->info;
    }
  }
  if ((pOVar7->status_val == -6) && (cVar3 = check_termination(work,1), cVar3 == 0)) {
    update_status(work->info,-6);
  }
  cVar10 = compute_rho_estimate(work);
  work->info->rho_estimate = cVar10;
  cVar10 = osqp_toc(work->timer);
  pOVar7 = work->info;
  pOVar7->solve_time = cVar10;
  if ((work->settings->polish != 0) && (pOVar7->status_val == 1)) {
    polish(work);
  }
  pOVar7 = work->info;
  if (work->first_run == 0) {
    pOVar7->run_time = pOVar7->solve_time + pOVar7->update_time + pOVar7->polish_time;
  }
  else {
    pOVar7->run_time = pOVar7->solve_time + pOVar7->setup_time + pOVar7->polish_time;
    work->first_run = 0;
  }
  work->clear_update_time = 1;
  work->rho_update_from_solve = 0;
  if (work->settings->verbose != 0) {
    print_footer(pOVar7,work->settings->polish);
  }
  store_solution(work);
  cVar3 = 0;
LAB_001a97cd:
  osqp_end_interrupt_listener();
  return cVar3;
}

Assistant:

c_int osqp_solve(OSQPWorkspace *work) {

  c_int exitflag;
  c_int iter;
  c_int compute_cost_function; // Boolean: compute the cost function in the loop or not
  c_int can_check_termination; // Boolean: check termination or not

#ifdef PROFILING
  c_float temp_run_time;       // Temporary variable to store current run time
#endif /* ifdef PROFILING */

#ifdef PRINTING
  c_int can_print;             // Boolean whether you can print
#endif /* ifdef PRINTING */

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

#ifdef PROFILING
  if (work->clear_update_time == 1)
    work->info->update_time = 0.0;
  work->rho_update_from_solve = 1;
#endif /* ifdef PROFILING */

  // Initialize variables
  exitflag              = 0;
  can_check_termination = 0;
#ifdef PRINTING
  can_print = work->settings->verbose;
#endif /* ifdef PRINTING */
#ifdef PRINTING
  compute_cost_function = work->settings->verbose; // Compute cost function only
                                                   // if verbose is on
#else /* ifdef PRINTING */
  compute_cost_function = 0;                       // Never compute cost
                                                   // function during the
                                                   // iterations if no printing
                                                   // enabled
#endif /* ifdef PRINTING */



#ifdef PROFILING
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */


#ifdef PRINTING

  if (work->settings->verbose) {
    // Print Header for every column
    print_header();
  }
#endif /* ifdef PRINTING */

#ifdef CTRLC

  // initialize Ctrl-C support
  osqp_start_interrupt_listener();
#endif /* ifdef CTRLC */

  // Initialize variables (cold start or warm start depending on settings)
  if (!work->settings->warm_start) cold_start(work);  // If not warm start ->
                                                      // set x, z, y to zero

  // Main ADMM algorithm
  for (iter = 1; iter <= work->settings->max_iter; iter++) {
    // Update x_prev, z_prev (preallocated, no malloc)
    swap_vectors(&(work->x), &(work->x_prev));
    swap_vectors(&(work->z), &(work->z_prev));

    /* ADMM STEPS */
    /* Compute \tilde{x}^{k+1}, \tilde{z}^{k+1} */
    update_xz_tilde(work);

    /* Compute x^{k+1} */
    update_x(work);

    /* Compute z^{k+1} */
    update_z(work);

    /* Compute y^{k+1} */
    update_y(work);

    /* End of ADMM Steps */

#ifdef CTRLC

    // Check the interrupt signal
    if (osqp_is_interrupted()) {
      update_status(work->info, OSQP_SIGINT);
# ifdef PRINTING
      c_print("Solver interrupted\n");
# endif /* ifdef PRINTING */
      exitflag = 1;
      goto exit;
    }
#endif /* ifdef CTRLC */

#ifdef PROFILING

    // Check if solver time_limit is enabled. In case, check if the current
    // run time is more than the time_limit option.
    if (work->first_run) {
      temp_run_time = work->info->setup_time + osqp_toc(work->timer);
    }
    else {
      temp_run_time = work->info->update_time + osqp_toc(work->timer);
    }

    if (work->settings->time_limit &&
        (temp_run_time >= work->settings->time_limit)) {
      update_status(work->info, OSQP_TIME_LIMIT_REACHED);
# ifdef PRINTING
      if (work->settings->verbose) c_print("run time limit reached\n");
      can_print = 0;  // Not printing at this iteration
# endif /* ifdef PRINTING */
      break;
    }
#endif /* ifdef PROFILING */


    // Can we check for termination ?
    can_check_termination = work->settings->check_termination &&
                            (iter % work->settings->check_termination == 0);

#ifdef PRINTING

    // Can we print ?
    can_print = work->settings->verbose &&
                ((iter % PRINT_INTERVAL == 0) || (iter == 1));

    if (can_check_termination || can_print) { // Update status in either of
                                              // these cases
      // Update information
      update_info(work, iter, compute_cost_function, 0);

      if (can_print) {
        // Print summary
        print_summary(work);
      }

      if (can_check_termination) {
        // Check algorithm termination
        if (check_termination(work, 0)) {
          // Terminate algorithm
          break;
        }
      }
    }
#else /* ifdef PRINTING */

    if (can_check_termination) {
      // Update information and compute also objective value
      update_info(work, iter, compute_cost_function, 0);

      // Check algorithm termination
      if (check_termination(work, 0)) {
        // Terminate algorithm
        break;
      }
    }
#endif /* ifdef PRINTING */


#if EMBEDDED != 1
# ifdef PROFILING

    // If adaptive rho with automatic interval, check if the solve time is a
    // certain fraction
    // of the setup time.
    if (work->settings->adaptive_rho && !work->settings->adaptive_rho_interval) {
      // Check time
      if (osqp_toc(work->timer) >
          work->settings->adaptive_rho_fraction * work->info->setup_time) {
        // Enough time has passed. We now get the number of iterations between
        // the updates.
        if (work->settings->check_termination) {
          // If check_termination is enabled, we round the number of iterations
          // between
          // rho updates to the closest multiple of check_termination
          work->settings->adaptive_rho_interval = (c_int)c_roundmultiple(iter,
                                                                         work->settings->check_termination);
        } else {
          // If check_termination is disabled, we round the number of iterations
          // between
          // updates to the closest multiple of the default check_termination
          // interval.
          work->settings->adaptive_rho_interval = (c_int)c_roundmultiple(iter,
                                                                         CHECK_TERMINATION);
        }

        // Make sure the interval is not 0 and at least check_termination times
        work->settings->adaptive_rho_interval = c_max(
          work->settings->adaptive_rho_interval,
          work->settings->check_termination);
      } // If time condition is met
    }   // If adaptive rho enabled and interval set to auto
# endif // PROFILING

    // Adapt rho
    if (work->settings->adaptive_rho &&
        work->settings->adaptive_rho_interval &&
        (iter % work->settings->adaptive_rho_interval == 0)) {
      // Update info with the residuals if it hasn't been done before
# ifdef PRINTING

      if (!can_check_termination && !can_print) {
        // Information has not been computed neither for termination or printing
        // reasons
        update_info(work, iter, compute_cost_function, 0);
      }
# else /* ifdef PRINTING */

      if (!can_check_termination) {
        // Information has not been computed before for termination check
        update_info(work, iter, compute_cost_function, 0);
      }
# endif /* ifdef PRINTING */

      // Actually update rho
      if (adapt_rho(work)) {
# ifdef PRINTING
        c_eprint("Failed rho update");
# endif // PRINTING
        exitflag = 1;
        goto exit;
      }
    }
#endif // EMBEDDED != 1

  }        // End of ADMM for loop


  // Update information and check termination condition if it hasn't been done
  // during last iteration (max_iter reached or check_termination disabled)
  if (!can_check_termination) {
    /* Update information */
#ifdef PRINTING

    if (!can_print) {
      // Update info only if it hasn't been updated before for printing
      // reasons
      update_info(work, iter - 1, compute_cost_function, 0);
    }
#else /* ifdef PRINTING */

    // If no printing is enabled, update info directly
    update_info(work, iter - 1, compute_cost_function, 0);
#endif /* ifdef PRINTING */

#ifdef PRINTING

    /* Print summary */
    if (work->settings->verbose && !work->summary_printed) print_summary(work);
#endif /* ifdef PRINTING */

    /* Check whether a termination criterion is triggered */
    check_termination(work, 0);
  }

  // Compute objective value in case it was not
  // computed during the iterations
  if (!compute_cost_function && has_solution(work->info)){
    work->info->obj_val = compute_obj_val(work, work->x);
  }


#ifdef PRINTING
  /* Print summary for last iteration */
  if (work->settings->verbose && !work->summary_printed) {
    print_summary(work);
  }
#endif /* ifdef PRINTING */

  /* if max iterations reached, change status accordingly */
  if (work->info->status_val == OSQP_UNSOLVED) {
    if (!check_termination(work, 1)) { // Try to check for approximate
      update_status(work->info, OSQP_MAX_ITER_REACHED);
    }
  }

#ifdef PROFILING
  /* if time-limit reached check termination and update status accordingly */
 if (work->info->status_val == OSQP_TIME_LIMIT_REACHED) {
    if (!check_termination(work, 1)) { // Try for approximate solutions
      update_status(work->info, OSQP_TIME_LIMIT_REACHED); /* Change update status back to OSQP_TIME_LIMIT_REACHED */
    }
  }
#endif /* ifdef PROFILING */


#if EMBEDDED != 1
  /* Update rho estimate */
  work->info->rho_estimate = compute_rho_estimate(work);
#endif /* if EMBEDDED != 1 */

  /* Update solve time */
#ifdef PROFILING
  work->info->solve_time = osqp_toc(work->timer);
#endif /* ifdef PROFILING */


#ifndef EMBEDDED
  // Polish the obtained solution
  if (work->settings->polish && (work->info->status_val == OSQP_SOLVED))
    polish(work);
#endif /* ifndef EMBEDDED */

#ifdef PROFILING
  /* Update total time */
  if (work->first_run) {
    // total time: setup + solve + polish
    work->info->run_time = work->info->setup_time +
                           work->info->solve_time +
                           work->info->polish_time;
  } else {
    // total time: update + solve + polish
    work->info->run_time = work->info->update_time +
                           work->info->solve_time +
                           work->info->polish_time;
  }

  // Indicate that the solve function has already been executed
  if (work->first_run) work->first_run = 0;

  // Indicate that the update_time should be set to zero
  work->clear_update_time = 1;

  // Indicate that osqp_update_rho is not called from osqp_solve
  work->rho_update_from_solve = 0;
#endif /* ifdef PROFILING */

#ifdef PRINTING
  /* Print final footer */
  if (work->settings->verbose) print_footer(work->info, work->settings->polish);
#endif /* ifdef PRINTING */

  // Store solution
  store_solution(work);


// Define exit flag for quitting function
#if defined(PROFILING) || defined(CTRLC) || EMBEDDED != 1
exit:
#endif /* if defined(PROFILING) || defined(CTRLC) || EMBEDDED != 1 */

#ifdef CTRLC
  // Restore previous signal handler
  osqp_end_interrupt_listener();
#endif /* ifdef CTRLC */

  return exitflag;
}